

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue * build_arg_list(JSContext *ctx,uint32_t *plen,JSValue array_arg)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  JSValue *tab;
  JSValueUnion JVar4;
  long lVar5;
  int64_t *piVar6;
  uint32_t len_00;
  JSValueUnion JVar7;
  int64_t iVar8;
  void *pvVar9;
  JSValue JVar10;
  JSValue prop;
  uint32_t len;
  uint local_54;
  JSValueUnion local_50;
  uint32_t *local_48;
  JSValueUnion local_40;
  
  local_50 = array_arg.u;
  if ((int)array_arg.tag != -1) {
    JS_ThrowTypeError(ctx,"not a object");
    return (JSValue *)0x0;
  }
  iVar3 = js_get_length32(ctx,&local_54,array_arg);
  if (iVar3 == 0) {
    pvVar9 = (void *)(ulong)local_54;
    if ((void *)0x10000 < pvVar9) {
      JS_ThrowInternalError(ctx,"too many arguments");
      return (JSValue *)0x0;
    }
    tab = (JSValue *)js_mallocz(ctx,(ulong)((local_54 + (local_54 == 0)) * 0x10));
    if (tab != (JSValue *)0x0) {
      local_48 = plen;
      if ((((*(short *)((long)local_50.ptr + 6) == 8) || (*(short *)((long)local_50.ptr + 6) == 2))
          && ((*(byte *)((long)local_50.ptr + 5) & 8) != 0)) &&
         (local_54 == *(uint *)((long)local_50.ptr + 0x40))) {
        if (local_54 != 0) {
          lVar5 = 0;
          do {
            piVar1 = *(int **)(*(long *)((long)local_50.ptr + 0x38) + lVar5);
            uVar2 = *(undefined8 *)(*(long *)((long)local_50.ptr + 0x38) + 8 + lVar5);
            if (0xfffffff4 < (uint)uVar2) {
              *piVar1 = *piVar1 + 1;
            }
            *(int **)((long)&tab->u + lVar5) = piVar1;
            *(undefined8 *)((long)&tab->tag + lVar5) = uVar2;
            lVar5 = lVar5 + 0x10;
          } while ((long)pvVar9 << 4 != lVar5);
        }
      }
      else if (local_54 != 0) {
        local_40.float64 = local_50.float64;
        piVar6 = &tab->tag;
        JVar7.float64 = 0.0;
        do {
          len_00 = JVar7.int32;
          JVar4.float64 = (double)((ulong)JVar7.ptr & 0xffffffff);
          if (-1 < (int)len_00) {
            JVar4 = JVar7;
          }
          iVar8 = 7;
          if (-1 < (int)len_00) {
            iVar8 = 0;
          }
          JVar10.tag = array_arg.tag;
          JVar10.u.ptr = local_40.ptr;
          prop.tag = iVar8;
          prop.u.float64 = JVar4.float64;
          JVar10 = JS_GetPropertyValue(ctx,JVar10,prop);
          if ((int)JVar10.tag == 6) {
            free_arg_list(ctx,tab,len_00);
            return (JSValue *)0x0;
          }
          *(JSValueUnion *)(piVar6 + -1) = JVar10.u;
          *piVar6 = JVar10.tag;
          JVar7.float64 = JVar7.float64 + 1;
          piVar6 = piVar6 + 2;
        } while (pvVar9 != JVar7.ptr);
      }
      *local_48 = local_54;
      return tab;
    }
  }
  return (JSValue *)0x0;
}

Assistant:

static JSValue *build_arg_list(JSContext *ctx, uint32_t *plen,
                               JSValueConst array_arg)
{
    uint32_t len, i;
    JSValue *tab, ret;
    JSObject *p;

    if (JS_VALUE_GET_TAG(array_arg) != JS_TAG_OBJECT) {
        JS_ThrowTypeError(ctx, "not a object");
        return NULL;
    }
    if (js_get_length32(ctx, &len, array_arg))
        return NULL;
    if (len > JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many arguments");
        return NULL;
    }
    /* avoid allocating 0 bytes */
    tab = js_mallocz(ctx, sizeof(tab[0]) * max_uint32(1, len));
    if (!tab)
        return NULL;
    p = JS_VALUE_GET_OBJ(array_arg);
    if ((p->class_id == JS_CLASS_ARRAY || p->class_id == JS_CLASS_ARGUMENTS) &&
        p->fast_array &&
        len == p->u.array.count) {
        for(i = 0; i < len; i++) {
            tab[i] = JS_DupValue(ctx, p->u.array.u.values[i]);
        }
    } else {
        for(i = 0; i < len; i++) {
            ret = JS_GetPropertyUint32(ctx, array_arg, i);
            if (JS_IsException(ret)) {
                free_arg_list(ctx, tab, i);
                return NULL;
            }
            tab[i] = ret;
        }
    }
    *plen = len;
    return tab;
}